

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_add_checked(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode_00;
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  bool bVar4;
  uint8_t uVar5;
  char cVar6;
  int32_t iVar7;
  int iVar8;
  undefined8 in_RAX;
  shared_container_t *sc;
  array_container_t *c;
  container_t *c_00;
  run_container_t *prVar9;
  uint uVar10;
  ushort key;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  run_container_t *run;
  uint8_t newtypecode;
  uint8_t typecode;
  undefined8 uStack_38;
  
  iVar8 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  if (((long)iVar8 == 0) || (puVar2 = (r->high_low_container).keys, puVar2[(long)iVar8 + -1] == key)
     ) {
    uVar11 = iVar8 - 1;
  }
  else {
    uVar12 = iVar8 - 1;
    uVar10 = 0;
    uVar13 = uVar12;
    do {
      if ((int)uVar12 < (int)uVar10) {
        uVar11 = ~uVar10;
        break;
      }
      uVar11 = uVar10 + uVar12 >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar10 + uVar12 & 0xfffffffe));
      if (uVar1 < key) {
        uVar10 = uVar11 + 1;
        bVar4 = true;
        uVar11 = uVar13;
      }
      else if (key < uVar1) {
        uVar12 = uVar11 - 1;
        bVar4 = true;
        uVar11 = uVar13;
      }
      else {
        bVar4 = false;
      }
      uVar13 = uVar11;
    } while (bVar4);
  }
  uStack_38 = in_RAX;
  if ((int)uVar11 < 0) {
    c = array_container_create();
    c_00 = container_add(c,(uint16_t)val,'\x02',(uint8_t *)((long)&uStack_38 + 7));
    ra_insert_new_key_value_at(&r->high_low_container,~uVar11,key,c_00,uStack_38._7_1_);
  }
  else {
    uVar13 = uVar11 & 0xffff;
    puVar3 = (r->high_low_container).typecodes;
    sc = (shared_container_t *)(r->high_low_container).containers[uVar13];
    if (puVar3[uVar13] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar13);
    }
    *(shared_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar13 * 8)) = sc;
    typecode_00 = (r->high_low_container).typecodes[uVar13];
    uStack_38 = CONCAT17(typecode_00,(undefined7)uStack_38);
    run = *(run_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar13 * 8));
    prVar9 = run;
    uVar5 = typecode_00;
    if (typecode_00 == '\x04') {
      uVar5 = *(uint8_t *)&run->runs;
      prVar9 = *(run_container_t **)run;
    }
    if (uVar5 == '\x03') {
      iVar7 = run_container_cardinality(prVar9);
    }
    else {
      iVar7 = prVar9->n_runs;
    }
    uStack_38._0_7_ = CONCAT16(typecode_00,(undefined6)uStack_38);
    prVar9 = (run_container_t *)
             container_add(run,(uint16_t)val,typecode_00,(uint8_t *)((long)&uStack_38 + 6));
    if (prVar9 == run) {
      cVar6 = uStack_38._6_1_;
      if (uStack_38._6_1_ == '\x04') {
        cVar6 = *(char *)&run->runs;
        run = *(run_container_t **)run;
      }
      if (cVar6 == '\x03') {
        iVar8 = run_container_cardinality(run);
      }
      else {
        iVar8 = run->n_runs;
      }
      return iVar7 != iVar8;
    }
    container_free(run,typecode_00);
    (r->high_low_container).containers[uVar11] = prVar9;
    (r->high_low_container).typecodes[uVar11] = uStack_38._6_1_;
  }
  return true;
}

Assistant:

bool roaring_bitmap_add_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
            result = true;
        } else {
            const int newCardinality =
                container_get_cardinality(container, newtypecode);

            result = oldCardinality != newCardinality;
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container =
            container_add(newac, val & 0xFFFF, ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
        result = true;
    }

    return result;
}